

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c,
          AlphaNum *d,AlphaNum *e,AlphaNum *f,AlphaNum *g,AlphaNum *h,AlphaNum *i)

{
  size_t sVar1;
  pointer pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,
             (char)a->piece_size_ + (char)*(undefined8 *)(this + 8) + (char)b->piece_size_ +
             (char)c->piece_size_ + (char)d->piece_size_ + (char)e->piece_size_ +
             (char)f->piece_size_ + (char)g->piece_size_ + (char)h->piece_size_);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  memcpy(pcVar2,*(void **)this,*(size_t *)(this + 8));
  pcVar2 = pcVar2 + *(long *)(this + 8);
  memcpy(pcVar2,a->piece_data_,a->piece_size_);
  pcVar2 = pcVar2 + a->piece_size_;
  memcpy(pcVar2,b->piece_data_,b->piece_size_);
  pcVar2 = pcVar2 + b->piece_size_;
  memcpy(pcVar2,c->piece_data_,c->piece_size_);
  pcVar2 = pcVar2 + c->piece_size_;
  memcpy(pcVar2,d->piece_data_,d->piece_size_);
  pcVar2 = pcVar2 + d->piece_size_;
  memcpy(pcVar2,e->piece_data_,e->piece_size_);
  pcVar2 = pcVar2 + e->piece_size_;
  memcpy(pcVar2,f->piece_data_,f->piece_size_);
  sVar1 = f->piece_size_;
  memcpy(pcVar2 + sVar1,g->piece_data_,g->piece_size_);
  memcpy(pcVar2 + sVar1 + g->piece_size_,h->piece_data_,h->piece_size_);
  return __return_storage_ptr__;
}

Assistant:

string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c,
              const AlphaNum &d, const AlphaNum &e, const AlphaNum &f,
              const AlphaNum &g, const AlphaNum &h, const AlphaNum &i) {
  string result;
  result.resize(a.size() + b.size() + c.size() + d.size() + e.size() +
                f.size() + g.size() + h.size() + i.size());
  char *const begin = &*result.begin();
  char *out = Append4(begin, a, b, c, d);
  out = Append4(out, e, f, g, h);
  out = Append1(out, i);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}